

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTTPSocket.cpp
# Opt level: O2

HTTPParser * __thiscall uWS::HTTPParser::operator++(HTTPParser *this,int param_1)

{
  char *pcVar1;
  long lVar2;
  int iVar3;
  char cVar4;
  char *pcVar5;
  unsigned_long uVar6;
  char *pcVar7;
  
  pcVar7 = this->cursor;
  while ((pcVar5 = pcVar7 + 1, *pcVar7 != '\r' || (*pcVar5 != '\n'))) {
    this->cursor = pcVar5;
    pcVar7 = pcVar5;
  }
  pcVar5 = pcVar7 + 2;
  this->cursor = pcVar5;
  cVar4 = pcVar7[2];
  if ((cVar4 == '\r') && (pcVar7[3] == '\n')) {
    (this->value).first = (char *)0x0;
    (this->value).second = 0;
    (this->key).first = (char *)0x0;
    (this->key).second = 0;
  }
  else {
    uVar6 = 0;
    pcVar7 = pcVar5;
    while ((cVar4 != '\r' && (cVar4 != ':'))) {
      uVar6 = uVar6 + 1;
      pcVar1 = pcVar7 + 1;
      pcVar7 = pcVar7 + 1;
      cVar4 = *pcVar1;
    }
    (this->key).first = pcVar5;
    (this->key).second = uVar6;
    if (*pcVar7 == '\r') {
      (this->value).first = (char *)0x0;
      (this->value).second = 0;
    }
    else {
      do {
        pcVar5 = pcVar7;
        pcVar7 = pcVar5 + 1;
        this->cursor = pcVar7;
        iVar3 = isspace((int)pcVar5[1]);
      } while (iVar3 != 0);
      uVar6 = 0xffffffffffffffff;
      do {
        lVar2 = uVar6 + 2;
        uVar6 = uVar6 + 1;
      } while (pcVar5[lVar2] != '\r');
      (this->value).first = pcVar7;
      (this->value).second = uVar6;
    }
  }
  return this;
}

Assistant:

HTTPParser &operator++(int)
    {
        size_t length = 0;
        for (; !(cursor[0] == '\r' && cursor[1] == '\n'); cursor++);
        cursor += 2;
        if (cursor[0] == '\r' && cursor[1] == '\n') {
            key = value = {0, 0};
        } else {
            for (; cursor[length] != ':' && cursor[length] != '\r'; length++);
            key = {cursor, length};
            if (cursor[length] != '\r') {
                cursor += length;
                length = 0;
                while (isspace(*(++cursor)));
                for (; cursor[length] != '\r'; length++);
                value = {cursor, length};
            } else {
                value = {0, 0};
            }
        }
        return *this;
    }